

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t best_effort_strncat_in_locale
                  (archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  uint uVar1;
  archive_string *paVar2;
  byte *pbVar3;
  void *in_RCX;
  long in_RDX;
  byte *in_RSI;
  long *in_RDI;
  wchar_t return_value;
  size_t avail;
  uint8_t *itp;
  char *otp;
  size_t remaining;
  size_t in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  wchar_t wVar4;
  archive_string *in_stack_ffffffffffffffb8;
  byte *local_40;
  archive_string_conv *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  wchar_t local_4;
  
  wVar4 = L'\0';
  if (*(int *)((long)in_RCX + 0x20) == 0) {
    paVar2 = archive_string_ensure(in_stack_ffffffffffffffb8,(ulong)in_stack_ffffffffffffffb0);
    if (paVar2 != (archive_string *)0x0) {
      pbVar3 = (byte *)(*in_RDI + in_RDI[1]);
      paVar2 = (archive_string *)((in_RDI[2] - in_RDI[1]) + -1);
      local_40 = in_RSI;
      while( true ) {
        uVar1 = in_stack_ffffffffffffffb0 & 0xffffff;
        if (*local_40 != 0) {
          uVar1 = CONCAT13(in_RDX != 0,(int3)in_stack_ffffffffffffffb0);
        }
        in_stack_ffffffffffffffb0 = uVar1;
        if ((char)(in_stack_ffffffffffffffb0 >> 0x18) == '\0') break;
        if ((*local_40 < 0x80) || ((*(uint *)((long)in_RCX + 0x24) & 0x100) == 0)) {
          if (*local_40 < 0x80) {
            *pbVar3 = *local_40;
          }
          else {
            *pbVar3 = 0x3f;
            wVar4 = L'\xffffffff';
          }
          pbVar3 = pbVar3 + 1;
        }
        else {
          if (paVar2 < (archive_string *)0x3) {
            in_RDI[1] = (long)pbVar3 - *in_RDI;
            paVar2 = archive_string_ensure(paVar2,CONCAT44(wVar4,in_stack_ffffffffffffffb0));
            if (paVar2 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            pbVar3 = (byte *)(*in_RDI + in_RDI[1]);
            paVar2 = (archive_string *)((in_RDI[2] - in_RDI[1]) + -1);
          }
          *pbVar3 = 0xef;
          pbVar3[1] = 0xbf;
          pbVar3[2] = 0xbd;
          pbVar3 = pbVar3 + 3;
          paVar2 = (archive_string *)((long)&paVar2[-1].buffer_length + 5);
          wVar4 = L'\xffffffff';
        }
        in_RDX = in_RDX + -1;
        local_40 = local_40 + 1;
      }
      in_RDI[1] = (long)pbVar3 - *in_RDI;
      *(undefined1 *)(*in_RDI + in_RDI[1]) = 0;
      return wVar4;
    }
    local_4 = L'\xffffffff';
  }
  else {
    paVar2 = archive_string_append
                       (in_stack_ffffffffffffffb8,(char *)(ulong)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
    if (paVar2 == (archive_string *)0x0) {
      local_4 = L'\xffffffff';
    }
    else {
      local_4 = invalid_mbs(in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return local_4;
}

Assistant:

static int
best_effort_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	size_t remaining;
	char *otp;
	const uint8_t *itp;
	size_t avail;
	int return_value = 0; /* success */

	/*
	 * If both from-locale and to-locale is the same, this makes a copy.
	 * And then this checks all copied MBS can be WCS if so returns 0.
	 */
	if (sc->same) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (invalid_mbs(_p, length, sc));
	}

	/*
	 * If a character is ASCII, this just copies it. If not, this
	 * assigns '?' charater instead but in UTF-8 locale this assigns
	 * byte sequence 0xEF 0xBD 0xBD, which are code point U+FFFD,
	 * a Replacement Character in Unicode.
	 */
	if (archive_string_ensure(as, as->length + length + 1) == NULL)
		return (-1);

	remaining = length;
	itp = (const uint8_t *)_p;
	otp = as->s + as->length;
	avail = as->buffer_length - as->length -1;
	while (*itp && remaining > 0) {
		if (*itp > 127 && (sc->flag & SCONV_TO_UTF8)) {
			if (avail < UTF8_R_CHAR_SIZE) {
				as->length = otp - as->s;
				if (NULL == archive_string_ensure(as,
				    as->buffer_length + remaining +
				    UTF8_R_CHAR_SIZE))
					return (-1);
				otp = as->s + as->length;
				avail = as->buffer_length - as->length -1;
			}
			/*
		 	 * When coping a string in UTF-8, unknown character
			 * should be U+FFFD (replacement character).
			 */
			UTF8_SET_R_CHAR(otp);
			otp += UTF8_R_CHAR_SIZE;
			avail -= UTF8_R_CHAR_SIZE;
			itp++;
			remaining--;
			return_value = -1;
		} else if (*itp > 127) {
			*otp++ = '?';
			itp++;
			remaining--;
			return_value = -1;
		} else {
			*otp++ = (char)*itp++;
			remaining--;
		}
	}
	as->length = otp - as->s;
	as->s[as->length] = '\0';
	return (return_value);
}